

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O1

TestStatus *
vkt::api::anon_unknown_0::resetPoolNoFlagsTest(TestStatus *__return_storage_ptr__,Context *context)

{
  VkDevice *ppVVar1;
  VkCommandPool obj;
  VkResult result;
  VkDevice device;
  DeviceInterface *vk;
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  VkCommandPoolCreateInfo cmdPoolParams;
  Move<vk::Handle<(vk::HandleType)24>_> local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_50;
  VkCommandPoolCreateInfo local_38;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_38.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_38.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_38.pNext = (void *)0x0;
  local_38.flags = 0;
  ::vk::createCommandPool(&local_78,vk,device,&local_38,(VkAllocationCallbacks *)0x0);
  DStack_50.m_device._0_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device._0_4_;
  DStack_50.m_device._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device._4_4_;
  DStack_50.m_allocator._0_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._0_4_;
  DStack_50.m_allocator._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator._4_4_;
  local_58 = (undefined4)
             local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal;
  uStack_54 = local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal._4_4_
  ;
  DStack_50.m_deviceIface._0_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_50.m_deviceIface._4_4_ =
       local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface._4_4_;
  result = (*vk->_vptr_DeviceInterface[0x46])
                     (vk,device,
                      local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                      m_internal,0);
  ::vk::checkResult(result,"vk.resetCommandPool(vkDevice, *cmdPool, 0u)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x24c);
  ppVVar1 = &local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device;
  local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
       (deUint64)ppVVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"Command Pool allocated correctly.","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,
             local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal,
             (undefined1 *)
             (CONCAT44(local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                       m_deviceIface._4_4_,
                       local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                       m_deviceIface._0_4_) +
             local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal));
  if ((VkDevice *)local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
      != ppVVar1) {
    operator_delete((void *)local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                            m_internal,
                    CONCAT44(local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                             m_device._4_4_,
                             local_78.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                             m_device._0_4_) + 1);
  }
  obj.m_internal._4_4_ = uStack_54;
  obj.m_internal._0_4_ = local_58;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_50,obj);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus resetPoolNoFlagsTest(Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType;
		DE_NULL,													// pNext;
		0u,															// flags;
		queueFamilyIndex,											// queueFamilyIndex;
	};

	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams, DE_NULL));

	VK_CHECK(vk.resetCommandPool(vkDevice, *cmdPool, 0u));

	return tcu::TestStatus::pass("Command Pool allocated correctly.");
}